

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O2

string * __thiscall
VulkanHppGenerator::combineDataTypes
          (string *__return_storage_ptr__,VulkanHppGenerator *this,
          map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
          *vectorParams,vector<unsigned_long,_std::allocator<unsigned_long>_> *returnParams,
          bool enumerating,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *dataTypes,CommandFlavourFlags flavourFlags,bool raii)

{
  pointer puVar1;
  pointer pbVar2;
  size_t sVar3;
  _Base_ptr p_Var4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar5;
  string *this_00;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  *this_01;
  byte bVar6;
  const_iterator cVar7;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>
  _Var8;
  long lVar9;
  ulong uVar10;
  byte bVar11;
  size_type __n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_02;
  bool bVar12;
  bool bVar13;
  allocator<char> local_20a;
  allocator<char> local_209;
  long local_208;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_200;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  modifiedDataTypes;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  string *local_158;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  *local_150;
  _Base_ptr local_148;
  ulong local_140;
  long local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  __n = (long)(dataTypes->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(dataTypes->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start >> 5;
  local_158 = __return_storage_ptr__;
  if (__n != (long)(returnParams->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(returnParams->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                   ._M_impl.super__Vector_impl_data._M_start >> 3) {
    __assert_fail("dataTypes.size() == returnParams.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                  ,0x585,
                  "std::string VulkanHppGenerator::combineDataTypes(const std::map<size_t, VectorParamData> &, const std::vector<size_t> &, bool, const std::vector<std::string> &, CommandFlavourFlags, bool) const"
                 );
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&modifiedDataTypes,__n,(allocator_type *)&local_178);
  local_148 = &(vectorParams->_M_t)._M_impl.super__Rb_tree_header._M_header;
  bVar6 = (flavourFlags.m_mask & 8) >> 3 | raii;
  lVar9 = 0;
  local_208 = 0;
  uVar10 = 0;
  local_200 = returnParams;
  local_150 = &vectorParams->_M_t;
  while( true ) {
    this_01 = local_150;
    this_00 = local_158;
    puVar1 = (local_200->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(local_200->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                      ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3) <= uVar10)
    break;
    local_140 = uVar10;
    local_138 = lVar9;
    cVar7 = std::
            _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
            ::find(local_150,(key_type *)((long)puVar1 + lVar9));
    bVar12 = (flavourFlags.m_mask & 4) != 0;
    bVar13 = cVar7._M_node == local_148;
    if (bVar13 || bVar12) {
      std::__cxx11::string::string
                ((string *)&local_178,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&(((dataTypes->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                 local_208));
      bVar11 = 0;
    }
    else {
      std::operator+(&local_d0,"std::vector<",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&(((dataTypes->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                     local_208));
      if (bVar6 == 0) {
        pbVar2 = (dataTypes->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b0,"VULKAN_HPP_NAMESPACE::",&local_20a);
        stripPrefix(&local_70,(string *)((long)&(pbVar2->_M_dataplus)._M_p + local_208),&local_b0);
        anon_unknown.dwarf_dd40c::startUpperCase(&local_50,&local_70);
        std::operator+(&local_90,", ",&local_50);
        std::operator+(&local_f0,&local_90,"Allocator>");
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,">",&local_209);
      }
      std::operator+(&local_178,&local_d0,&local_f0);
      bVar11 = bVar6 ^ 1;
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&((modifiedDataTypes.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + local_208),
               &local_178);
    std::__cxx11::string::~string((string *)&local_178);
    if (!bVar13 && !bVar12) {
      std::__cxx11::string::~string((string *)&local_f0);
    }
    if (bVar11 != 0) {
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_b0);
    }
    if (!bVar13 && !bVar12) {
      std::__cxx11::string::~string((string *)&local_d0);
    }
    uVar10 = local_140 + 1;
    local_208 = local_208 + 0x20;
    lVar9 = local_138 + 8;
  }
  (local_158->_M_dataplus)._M_p = (pointer)&local_158->field_2;
  local_158->_M_string_length = 0;
  (local_158->field_2)._M_local_buf[0] = '\0';
  switch((long)modifiedDataTypes.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)modifiedDataTypes.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start >> 5) {
  case 0:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
              (local_158,"void");
    goto LAB_00123bc6;
  case 1:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (local_158,
               modifiedDataTypes.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    goto LAB_00123bc6;
  case 2:
    if (enumerating) {
      bVar12 = std::
               map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
               ::contains((map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                           *)local_150,puVar1 + 1);
      pvVar5 = local_200;
      if ((!bVar12) ||
         (cVar7 = std::
                  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                  ::find(this_01,(local_200->
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                                 _M_impl.super__Vector_impl_data._M_start + 1),
         cVar7._M_node[1]._M_parent !=
         (_Base_ptr)
         *(pvVar5->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start)) {
        __assert_fail("!enumerating || ( vectorParams.contains( returnParams[1] ) && ( vectorParams.find( returnParams[1] )->second.lenParam == returnParams[0] ) )"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                      ,0x599,
                      "std::string VulkanHppGenerator::combineDataTypes(const std::map<size_t, VectorParamData> &, const std::vector<size_t> &, bool, const std::vector<std::string> &, CommandFlavourFlags, bool) const"
                     );
      }
      std::__cxx11::string::string
                ((string *)&local_178,
                 modifiedDataTypes.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1);
    }
    else {
      std::operator+(&local_1d8,"std::pair<",
                     modifiedDataTypes.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
      std::operator+(&local_1b8,&local_1d8,", ");
      std::operator+(&local_198,&local_1b8,
                     modifiedDataTypes.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 1);
      std::operator+(&local_178,&local_198,">");
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (this_00,&local_178);
    std::__cxx11::string::~string((string *)&local_178);
    if (enumerating) goto LAB_00123bc6;
LAB_00123ba5:
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::~string((string *)&local_1b8);
    this_02 = &local_1d8;
    break;
  case 3:
    sVar3 = (local_150->_M_impl).super__Rb_tree_header._M_node_count;
    if (sVar3 == 2) {
      if (!enumerating) {
        __assert_fail("enumerating",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                      ,0x5a9,
                      "std::string VulkanHppGenerator::combineDataTypes(const std::map<size_t, VectorParamData> &, const std::vector<size_t> &, bool, const std::vector<std::string> &, CommandFlavourFlags, bool) const"
                     );
      }
      _Var8._M_node = (local_150->_M_impl).super__Rb_tree_header._M_header._M_left;
      if ((((*(unsigned_long *)(_Var8._M_node + 1) != puVar1[1]) ||
           (_Var8._M_node[1]._M_parent != (_Base_ptr)*puVar1)) ||
          (_Var8 = std::
                   next<std::_Rb_tree_const_iterator<std::pair<unsigned_long_const,VulkanHppGenerator::VectorParamData>>>
                             (_Var8,1),
          *(unsigned_long *)(_Var8._M_node + 1) !=
          (local_200->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start[2])) ||
         (_Var8 = std::
                  next<std::_Rb_tree_const_iterator<std::pair<unsigned_long_const,VulkanHppGenerator::VectorParamData>>>
                            ((this_01->_M_impl).super__Rb_tree_header._M_header._M_left,1),
         _Var8._M_node[1]._M_parent !=
         (_Base_ptr)
         *(local_200->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start)) {
        __assert_fail("( vectorParams.begin()->first == returnParams[1] ) && ( vectorParams.begin()->second.lenParam == returnParams[0] ) && ( std::next( vectorParams.begin() )->first == returnParams[2] ) && ( std::next( vectorParams.begin() )->second.lenParam == returnParams[0] )"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                      ,0x5ac,
                      "std::string VulkanHppGenerator::combineDataTypes(const std::map<size_t, VectorParamData> &, const std::vector<size_t> &, bool, const std::vector<std::string> &, CommandFlavourFlags, bool) const"
                     );
      }
      std::operator+(&local_1d8,"std::pair<",
                     modifiedDataTypes.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 1);
      std::operator+(&local_1b8,&local_1d8,", ");
      std::operator+(&local_198,&local_1b8,
                     modifiedDataTypes.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 2);
      std::operator+(&local_178,&local_198,">");
LAB_00123b8a:
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (this_00,&local_178);
      std::__cxx11::string::~string((string *)&local_178);
      goto LAB_00123ba5;
    }
    if (sVar3 == 1) {
      if (!enumerating) {
        __assert_fail("enumerating",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                      ,0x5a4,
                      "std::string VulkanHppGenerator::combineDataTypes(const std::map<size_t, VectorParamData> &, const std::vector<size_t> &, bool, const std::vector<std::string> &, CommandFlavourFlags, bool) const"
                     );
      }
      p_Var4 = (local_150->_M_impl).super__Rb_tree_header._M_header._M_left;
      if ((*(unsigned_long *)(p_Var4 + 1) != puVar1[2]) ||
         (p_Var4[1]._M_parent != (_Base_ptr)puVar1[1])) {
        __assert_fail("( vectorParams.begin()->first == returnParams[2] ) && ( vectorParams.begin()->second.lenParam == returnParams[1] )"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                      ,0x5a5,
                      "std::string VulkanHppGenerator::combineDataTypes(const std::map<size_t, VectorParamData> &, const std::vector<size_t> &, bool, const std::vector<std::string> &, CommandFlavourFlags, bool) const"
                     );
      }
      std::operator+(&local_1d8,"std::pair<",
                     modifiedDataTypes.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
      std::operator+(&local_1b8,&local_1d8,", ");
      std::operator+(&local_198,&local_1b8,
                     modifiedDataTypes.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 2);
      std::operator+(&local_178,&local_198,">");
      goto LAB_00123b8a;
    }
    if (sVar3 != 0) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                    ,0x5af,
                    "std::string VulkanHppGenerator::combineDataTypes(const std::map<size_t, VectorParamData> &, const std::vector<size_t> &, bool, const std::vector<std::string> &, CommandFlavourFlags, bool) const"
                   );
    }
    if (enumerating) {
      __assert_fail("!enumerating",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                    ,0x5a0,
                    "std::string VulkanHppGenerator::combineDataTypes(const std::map<size_t, VectorParamData> &, const std::vector<size_t> &, bool, const std::vector<std::string> &, CommandFlavourFlags, bool) const"
                   );
    }
    std::operator+(&local_130,"std::tuple<",
                   modifiedDataTypes.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
    std::operator+(&local_110,&local_130,", ");
    std::operator+(&local_1d8,&local_110,
                   modifiedDataTypes.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + 1);
    std::operator+(&local_1b8,&local_1d8,", ");
    std::operator+(&local_198,&local_1b8,
                   modifiedDataTypes.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + 2);
    std::operator+(&local_178,&local_198,">");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (this_00,&local_178);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_110);
    this_02 = &local_130;
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                  ,0x5b2,
                  "std::string VulkanHppGenerator::combineDataTypes(const std::map<size_t, VectorParamData> &, const std::vector<size_t> &, bool, const std::vector<std::string> &, CommandFlavourFlags, bool) const"
                 );
  }
  std::__cxx11::string::~string((string *)this_02);
LAB_00123bc6:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&modifiedDataTypes);
  return this_00;
}

Assistant:

std::string VulkanHppGenerator::combineDataTypes( std::map<size_t, VectorParamData> const & vectorParams,
                                                  std::vector<size_t> const &               returnParams,
                                                  bool                                      enumerating,
                                                  std::vector<std::string> const &          dataTypes,
                                                  CommandFlavourFlags                       flavourFlags,
                                                  bool                                      raii ) const
{
  assert( dataTypes.size() == returnParams.size() );

  std::vector<std::string> modifiedDataTypes( dataTypes.size() );
  for ( size_t i = 0; i < returnParams.size(); ++i )
  {
    auto vectorParamIt   = vectorParams.find( returnParams[i] );
    modifiedDataTypes[i] = ( vectorParamIt == vectorParams.end() || ( flavourFlags & CommandFlavourFlagBits::singular ) )
                           ? dataTypes[i]
                           : ( "std::vector<" + dataTypes[i] +
                               ( raii || ( flavourFlags & CommandFlavourFlagBits::unique )
                                   ? ">"
                                   : ( ", " + startUpperCase( stripPrefix( dataTypes[i], "VULKAN_HPP_NAMESPACE::" ) ) + "Allocator>" ) ) );
  }

  std::string combinedType;
  switch ( modifiedDataTypes.size() )
  {
    case 0: combinedType = "void"; break;
    case 1: combinedType = modifiedDataTypes[0]; break;
    case 2:
      assert( !enumerating || ( vectorParams.contains( returnParams[1] ) && ( vectorParams.find( returnParams[1] )->second.lenParam == returnParams[0] ) ) );
      combinedType = enumerating ? modifiedDataTypes[1] : ( "std::pair<" + modifiedDataTypes[0] + ", " + modifiedDataTypes[1] + ">" );
      break;
    case 3:
      switch ( vectorParams.size() )
      {
        case 0:
          assert( !enumerating );
          combinedType = "std::tuple<" + modifiedDataTypes[0] + ", " + modifiedDataTypes[1] + ", " + modifiedDataTypes[2] + ">";
          break;
        case 1:
          assert( enumerating );
          assert( ( vectorParams.begin()->first == returnParams[2] ) && ( vectorParams.begin()->second.lenParam == returnParams[1] ) );
          combinedType = "std::pair<" + modifiedDataTypes[0] + ", " + modifiedDataTypes[2] + ">";
          break;
        case 2:
          assert( enumerating );
          assert( ( vectorParams.begin()->first == returnParams[1] ) && ( vectorParams.begin()->second.lenParam == returnParams[0] ) &&
                  ( std::next( vectorParams.begin() )->first == returnParams[2] ) &&
                  ( std::next( vectorParams.begin() )->second.lenParam == returnParams[0] ) );
          combinedType = "std::pair<" + modifiedDataTypes[1] + ", " + modifiedDataTypes[2] + ">";
          break;
        default: assert( false ); break;
      }
      break;
    default: assert( false ); break;
  }
  return combinedType;
}